

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void CreateFile(uint64_t Size)

{
  long lVar1;
  undefined8 uVar2;
  ofstream fill;
  ofstream truncate;
  long local_428;
  filebuf local_420 [240];
  ios_base aiStack_330 [264];
  long local_228;
  filebuf local_220 [240];
  ios_base aiStack_130 [264];
  
  std::ofstream::ofstream(&local_228,(string *)&filename_abi_cxx11_,_S_out);
  std::ofstream::close();
  std::ofstream::ofstream(&local_428,(string *)&filename_abi_cxx11_,_S_out);
  if (Size != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"A",1);
      Size = Size - 1;
    } while (Size != 0);
  }
  std::ostream::flush();
  uVar2 = __filebuf;
  lVar1 = _VTT;
  local_428 = _VTT;
  *(undefined8 *)(local_420 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_420);
  std::ios_base::~ios_base(aiStack_330);
  local_228 = lVar1;
  *(undefined8 *)(local_220 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(aiStack_130);
  return;
}

Assistant:

void CreateFile(uint64_t Size)
{
    std::ofstream truncate(filename);
    truncate.close();

    std::ofstream fill(filename);
    for(uint64_t i = 0; i<Size; i++)
        { fill << "A"; }
    fill.flush();
}